

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_units.cpp
# Opt level: O3

void testTempContext(string *tempdir)

{
  int iVar1;
  ostream *poVar2;
  char *__s;
  size_t sVar3;
  char *in_RCX;
  char *pcVar4;
  exr_context_t c;
  int pc;
  undefined8 local_90;
  int local_84;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_90 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_80 = 0x68;
  local_28 = 0xbf800000fffffffe;
  local_84 = -1;
  puts("Testing initial temporary context API");
  iVar1 = exr_start_temporary_context(0,(tempdir->_M_dataplus)._M_p,0);
  if (iVar1 != 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(3);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_start_temporary_context (__null, tempdir.c_str (), __null)",(char *)0x1ba,
                   0x1814e4,in_RCX);
  }
  iVar1 = exr_start_temporary_context(&local_90,(tempdir->_M_dataplus)._M_p,0);
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_start_temporary_context (&c, tempdir.c_str (), __null)",(char *)0x1bc,
                   0x1814e4,in_RCX);
  }
  iVar1 = exr_get_count(local_90,&local_84);
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_count (c, &pc)",(char *)0x1bd,0x1814e4,in_RCX);
  }
  if (local_84 == 1) {
    exr_finish(&local_90);
    iVar1 = exr_start_temporary_context(&local_90,(tempdir->_M_dataplus)._M_p,&local_80);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar4 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_start_temporary_context ( &c, tempdir.c_str (), &cinit)",(char *)0x1c2,
                     0x1814e4,in_RCX);
    }
    pcVar4 = (char *)0x438;
    iVar1 = exr_initialize_required_attr_simple(local_90,0,0x780,0x438,0);
    if (iVar1 == 0) {
      exr_finish(&local_90);
      puts("ok.");
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    __s = (char *)exr_get_default_error_message(iVar1);
    if (__s == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_initialize_required_attr_simple ( c, 0, 1920, 1080, EXR_COMPRESSION_NONE)",
                   (char *)0x1c4,0x1814e4,pcVar4);
  }
  core_test_fail("pc == 1",(char *)0x1be,0x1814e4,in_RCX);
}

Assistant:

void testTempContext (const std::string& tempdir)
{
    exr_context_t c = NULL;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    int pc = -1;

    printf ("Testing initial temporary context API\n");

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_start_temporary_context (NULL, tempdir.c_str (), NULL));

    EXRCORE_TEST_RVAL (exr_start_temporary_context (&c, tempdir.c_str (), NULL));
    EXRCORE_TEST_RVAL (exr_get_count (c, &pc));
    EXRCORE_TEST (pc == 1);
    exr_finish (&c);

    EXRCORE_TEST_RVAL (exr_start_temporary_context (
                           &c, tempdir.c_str (), &cinit));
    EXRCORE_TEST_RVAL (exr_initialize_required_attr_simple (
                           c, 0, 1920, 1080, EXR_COMPRESSION_NONE));
    exr_finish (&c);

    printf ("ok.\n");
}